

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::BuiltinVariableShader::shadePrimitives
          (BuiltinVariableShader *this,GeometryEmitter *output,int verticesIn,
          PrimitivePacket *packets,int numPackets,int invocationID)

{
  long lVar1;
  long lVar2;
  GenericVec4 *varyings;
  Vec4 *position;
  int iVar3;
  long lVar4;
  long lVar5;
  float fVar6;
  Vector<float,_4> res_1;
  Vector<float,_4> res;
  Vec4 colors [4];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  Vec4 local_98;
  long local_88;
  BuiltinVariableShader *local_80;
  undefined8 local_78 [9];
  
  local_78[0] = 0x3f800000;
  local_78[1] = 0x3f80000000000000;
  local_78[2] = 0x3f80000000000000;
  local_78[3] = 0x3f80000000000000;
  local_78[4] = 0;
  local_78[5] = 0x3f8000003f800000;
  local_78[6] = 0x3f8000003f800000;
  local_78[7] = 0x3f80000000000000;
  if (0 < numPackets) {
    lVar4 = (ulong)(uint)numPackets * 0x38;
    lVar5 = 0;
    local_88 = lVar4;
    local_80 = this;
    do {
      lVar1 = *(long *)((long)packets->vertices + lVar5);
      iVar3 = *(int *)&(local_80->super_ShaderProgram).field_0x154;
      if (iVar3 == 2) {
        varyings = (GenericVec4 *)(lVar1 + 0x20);
        fVar6 = floorf(*(float *)(lVar1 + 0x20));
        fStack_a4 = *(float *)(lVar1 + 0xc) + 0.0;
        local_a8 = *(float *)(lVar1 + 8) + 0.05;
        fStack_9c = *(float *)(lVar1 + 0x14) + 0.0;
        fStack_a0 = *(float *)(lVar1 + 0x10) + 0.0;
        iVar3 = (int)fVar6 + 3;
        rr::GeometryEmitter::EmitVertex(output,(Vec4 *)&local_a8,1.0,varyings,iVar3);
        fStack_a4 = *(float *)(lVar1 + 0xc) + -0.0;
        local_a8 = *(float *)(lVar1 + 8) + -0.05;
        fStack_9c = *(float *)(lVar1 + 0x14) + -0.0;
        fStack_a0 = *(float *)(lVar1 + 0x10) + -0.0;
        rr::GeometryEmitter::EmitVertex(output,(Vec4 *)&local_a8,1.0,varyings,iVar3);
        fStack_a4 = *(float *)(lVar1 + 0xc) + 0.05;
        local_a8 = *(float *)(lVar1 + 8) + 0.0;
        fStack_9c = *(float *)(lVar1 + 0x14) + 0.0;
        fStack_a0 = *(float *)(lVar1 + 0x10) + 0.0;
        fVar6 = 1.0;
        position = (Vec4 *)&local_a8;
        lVar4 = local_88;
LAB_003a5075:
        rr::GeometryEmitter::EmitVertex(output,position,fVar6,varyings,iVar3);
      }
      else {
        if (iVar3 == 1) {
          iVar3 = *(int *)((long)packets->vertices + lVar5 + -8);
          lVar2 = (long)(iVar3 % 4);
          _local_a8 = local_78[lVar2 * 2];
          _fStack_a0 = local_78[lVar2 * 2 + 1];
          local_98.m_data[1] = *(float *)(lVar1 + 0xc) + 0.0;
          local_98.m_data[0] = *(float *)(lVar1 + 8) + 0.05;
          local_98.m_data[3] = *(float *)(lVar1 + 0x14) + 0.0;
          local_98.m_data[2] = *(float *)(lVar1 + 0x10) + 0.0;
          rr::GeometryEmitter::EmitVertex(output,&local_98,1.0,(GenericVec4 *)&local_a8,iVar3);
          local_98.m_data[1] = *(float *)(lVar1 + 0xc) + -0.0;
          local_98.m_data[0] = *(float *)(lVar1 + 8) + -0.05;
          local_98.m_data[3] = *(float *)(lVar1 + 0x14) + -0.0;
          local_98.m_data[2] = *(float *)(lVar1 + 0x10) + -0.0;
          rr::GeometryEmitter::EmitVertex
                    (output,&local_98,1.0,(GenericVec4 *)&local_a8,
                     *(int *)((long)packets->vertices + lVar5 + -8));
          local_98.m_data[1] = *(float *)(lVar1 + 0xc) + 0.05;
          local_98.m_data[0] = *(float *)(lVar1 + 8) + 0.0;
          local_98.m_data[3] = *(float *)(lVar1 + 0x14) + 0.0;
          local_98.m_data[2] = *(float *)(lVar1 + 0x10) + 0.0;
          iVar3 = *(int *)((long)packets->vertices + lVar5 + -8);
          fVar6 = 1.0;
          varyings = (GenericVec4 *)&local_a8;
          position = &local_98;
          goto LAB_003a5075;
        }
        if (iVar3 == 0) {
          fVar6 = *(float *)(lVar1 + 0x20) + 1.0;
          _local_a8 = 0x3f8000003f800000;
          _fStack_a0 = 0x3f8000003f800000;
          iVar3 = *(int *)((long)packets->vertices + lVar5 + -8);
          varyings = (GenericVec4 *)&local_a8;
          position = (Vec4 *)(lVar1 + 8);
          goto LAB_003a5075;
        }
      }
      rr::GeometryEmitter::EndPrimitive(output);
      lVar5 = lVar5 + 0x38;
    } while (lVar4 != lVar5);
  }
  return;
}

Assistant:

void BuiltinVariableShader::shadePrimitives (rr::GeometryEmitter& output, int verticesIn, const rr::PrimitivePacket* packets, const int numPackets, int invocationID) const
{
	DE_UNREF(verticesIn);
	DE_UNREF(invocationID);

	const tcu::Vec4 red			= tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f);
	const tcu::Vec4 green		= tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4 blue		= tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f);
	const tcu::Vec4 yellow		= tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4 colors[4]	= { red, green, blue, yellow };

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		const rr::VertexPacket*	vertex = packets[packetNdx].vertices[0];

		if (m_test == TEST_POINT_SIZE)
		{
			rr::GenericVec4	fragColor;
			const float		pointSize = vertex->outputs[0].get<float>().x() + 1.0f;

			fragColor = tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f);
			output.EmitVertex(vertex->position, pointSize, &fragColor, packets[packetNdx].primitiveIDIn);
		}
		else if (m_test == TEST_PRIMITIVE_ID_IN)
		{
			rr::GenericVec4	fragColor;
			fragColor = colors[packets[packetNdx].primitiveIDIn % 4];

			output.EmitVertex(vertex->position + tcu::Vec4(0.05f, 0.0f,  0.0f, 0.0f), 1.0f, &fragColor, packets[packetNdx].primitiveIDIn);
			output.EmitVertex(vertex->position - tcu::Vec4(0.05f, 0.0f,  0.0f, 0.0f), 1.0f, &fragColor, packets[packetNdx].primitiveIDIn);
			output.EmitVertex(vertex->position + tcu::Vec4(0.0f,  0.05f, 0.0f, 0.0f), 1.0f, &fragColor, packets[packetNdx].primitiveIDIn);
		}
		else if (m_test == TEST_PRIMITIVE_ID)
		{
			const int primitiveID = (int)deFloatFloor(vertex->outputs[0].get<float>().x()) + 3;

			output.EmitVertex(vertex->position + tcu::Vec4(0.05f, 0.0f,  0.0f, 0.0f), 1.0f, vertex->outputs, primitiveID);
			output.EmitVertex(vertex->position - tcu::Vec4(0.05f, 0.0f,  0.0f, 0.0f), 1.0f, vertex->outputs, primitiveID);
			output.EmitVertex(vertex->position + tcu::Vec4(0.0f,  0.05f, 0.0f, 0.0f), 1.0f, vertex->outputs, primitiveID);
		}
		else
			DE_ASSERT(DE_FALSE);

		output.EndPrimitive();
	}
}